

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O3

void icu_63::number::impl::blueprint_helpers::generateDigitsStem
               (int32_t minSig,int32_t maxSig,UnicodeString *sb,UErrorCode *param_4)

{
  undefined8 in_RAX;
  int iVar1;
  undefined8 uStack_28;
  
  iVar1 = minSig;
  uStack_28 = in_RAX;
  if (0 < minSig) {
    do {
      UnicodeString::append(sb,0x40);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  if (maxSig == -1) {
    uStack_28 = CONCAT26(0x2b,(undefined6)uStack_28);
    UnicodeString::doAppend(sb,(UChar *)((long)&uStack_28 + 6),0,1);
  }
  else {
    iVar1 = maxSig - minSig;
    if (iVar1 != 0 && minSig <= maxSig) {
      do {
        UnicodeString::append(sb,0x23);
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
  }
  return;
}

Assistant:

void
blueprint_helpers::generateDigitsStem(int32_t minSig, int32_t maxSig, UnicodeString& sb, UErrorCode&) {
    appendMultiple(sb, u'@', minSig);
    if (maxSig == -1) {
        sb.append(u'+');
    } else {
        appendMultiple(sb, u'#', maxSig - minSig);
    }
}